

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O1

int Wildcard::set(char **wildcard,char **test)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char cVar8;
  
  cVar1 = **wildcard;
  if (cVar1 == '!') {
    *wildcard = *wildcard + 1;
  }
  pcVar7 = *wildcard;
  cVar8 = *pcVar7;
  bVar4 = 0;
  uVar6 = 0;
  do {
    uVar5 = 1;
    if (uVar6 == 0) {
      if (cVar8 == '-') {
        cVar2 = pcVar7[1];
        if (!(bool)(~bVar4 & 1 | cVar2 == ']' | cVar2 <= pcVar7[-1])) {
          uVar5 = 0;
          if (**test <= cVar2 && pcVar7[-1] <= **test) {
            *wildcard = pcVar7 + 1;
            uVar5 = 1;
          }
          goto LAB_00275ef2;
        }
      }
      uVar5 = (uint)(cVar8 == **test);
    }
LAB_00275ef2:
    pcVar3 = *wildcard;
    pcVar7 = pcVar3 + 1;
    *wildcard = pcVar7;
    cVar8 = pcVar3[1];
    bVar4 = 1;
    uVar6 = uVar5;
    if (cVar8 == ']') {
      uVar6 = (uint)(cVar1 == '!');
      if (uVar5 != uVar6) {
        *test = *test + 1;
      }
      return uVar5 ^ uVar6;
    }
  } while( true );
}

Assistant:

int Wildcard::set(const char** wildcard, const char** test) {
  int fit          = 0;
  int negation     = 0;
  int at_beginning = 1;

  if ('!' == **wildcard) {
    negation = 1;
    (*wildcard)++;
  }
  while ((']' != **wildcard) || (1 == at_beginning)) {
    if (0 == fit) {
      if (('-' == **wildcard) && ((*(*wildcard - 1)) < (*(*wildcard + 1))) &&
          (']' != *(*wildcard + 1)) && (0 == at_beginning)) {
        if (((**test) >= (*(*wildcard - 1))) &&
            ((**test) <= (*(*wildcard + 1)))) {
          fit = 1;
          (*wildcard)++;
        }
      } else if ((**wildcard) == (**test)) {
        fit = 1;
      }
    }
    (*wildcard)++;
    at_beginning = 0;
  }
  if (1 == negation) /* change from zero to one and vice versa */
    fit = 1 - fit;
  if (1 == fit) (*test)++;

  return (fit);
}